

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool generateLowResWaveform<short>
               (TWaveformViewT<short> *waveform,TWaveformT<short> *waveformLowRes,int nWindow)

{
  short sVar1;
  short *psVar2;
  size_type __n;
  _Elt_pointer plVar3;
  size_type sVar4;
  size_type sVar5;
  short sVar6;
  size_type __n_00;
  long local_a8;
  TWaveformT<short> waveformAbs;
  deque<long,_std::allocator<long>_> que;
  
  std::vector<short,_std::allocator<short>_>::resize(waveformLowRes,waveform->n);
  __n_00 = (size_type)nWindow;
  std::deque<long,_std::allocator<long>_>::deque(&que,__n_00,(allocator_type *)&waveformAbs);
  psVar2 = waveform->samples;
  __n = waveform->n;
  std::vector<short,_std::allocator<short>_>::vector(&waveformAbs,__n,(allocator_type *)&local_a8);
  sVar4 = 0;
  sVar5 = 0;
  if (0 < (long)__n) {
    sVar5 = __n;
  }
  for (; sVar5 != sVar4; sVar4 = sVar4 + 1) {
    sVar1 = psVar2[sVar4];
    sVar6 = -sVar1;
    if (0 < sVar1) {
      sVar6 = sVar1;
    }
    waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_start[sVar4] = sVar6;
  }
  local_a8 = 0;
  do {
    if ((long)__n <= local_a8) {
      std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
                (&waveformAbs.super__Vector_base<short,_std::allocator<short>_>);
      std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base
                (&que.super__Deque_base<long,_std::allocator<long>_>);
      return true;
    }
    if (local_a8 < (long)__n_00) {
      while (que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur !=
             que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur) {
        plVar3 = que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
                 _M_finish._M_cur;
        if (que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_cur ==
            que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_first) {
          plVar3 = que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data
                   ._M_finish._M_node[-1] + 0x40;
        }
        if (waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start[local_a8] <
            waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start[plVar3[-1]]) break;
        std::deque<long,_std::allocator<long>_>::pop_back(&que);
      }
      std::deque<long,_std::allocator<long>_>::push_back(&que,&local_a8);
    }
    else {
      while( true ) {
        if ((que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur ==
             que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur) ||
           ((long)(local_a8 - __n_00) <
            *que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur)) break;
        std::deque<long,_std::allocator<long>_>::pop_front(&que);
      }
      while (que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur !=
             que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur) {
        plVar3 = que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
                 _M_finish._M_cur;
        if (que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_cur ==
            que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_first) {
          plVar3 = que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data
                   ._M_finish._M_node[-1] + 0x40;
        }
        if (waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start[local_a8] <
            waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start[plVar3[-1]]) break;
        std::deque<long,_std::allocator<long>_>::pop_back(&que);
      }
      std::deque<long,_std::allocator<long>_>::push_back(&que,&local_a8);
      (waveformLowRes->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
      super__Vector_impl_data._M_start[local_a8 - nWindow / 2] =
           waveformAbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start
           [*que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur];
    }
    local_a8 = local_a8 + 1;
  } while( true );
}

Assistant:

bool generateLowResWaveform(const TWaveformViewT<T> & waveform, TWaveformT<T> & waveformLowRes, int nWindow) {
    waveformLowRes.resize(waveform.n);

    int k = nWindow;
    std::deque<int64_t> que(k);

    //auto [samples, n] = waveform;
    auto samples = waveform.samples;
    auto n       = waveform.n;

    TWaveformT<T> waveformAbs(n);
    for (int64_t i = 0; i < n; ++i) {
        waveformAbs[i] = std::abs(samples[i]);
    }

    for (int64_t i = 0; i < n; ++i) {
        if (i < k) {
            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }
            que.push_back(i);
        } else {
            while((!que.empty()) && que.front() <= i - k) {
                que.pop_front();
            }

            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }

            que.push_back(i);

            int64_t itest = i - k/2;
            waveformLowRes[itest] = waveformAbs[que.front()];
        }
    }

    return true;
}